

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void av1_set_offsets(AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,
                    BLOCK_SIZE bsize)

{
  int iVar1;
  MB_MODE_INFO *pMVar2;
  ushort uVar3;
  EncSegmentationInfo *pEVar4;
  int iVar5;
  uint segment_id;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  
  av1_set_offsets_without_segment_id(cpi,tile,x,mi_row,mi_col,bsize);
  pMVar2 = *(x->e_mbd).mi;
  uVar3 = *(ushort *)&pMVar2->field_0xa7 & 0xfff8;
  *(ushort *)&pMVar2->field_0xa7 = uVar3;
  if ((cpi->common).seg.enabled != '\0') {
    segment_id = 0;
    if (cpi->vaq_refresh == 0) {
      pEVar4 = &cpi->enc_seg;
      if ((cpi->common).seg.update_map == '\0') {
        pEVar4 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
      }
      if (pEVar4->map == (uint8_t *)0x0) {
        segment_id = 0;
      }
      else {
        uVar6 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [bsize] <= (int)uVar6) {
          uVar6 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [bsize];
        }
        segment_id = 0;
        if (0 < (int)uVar6) {
          iVar1 = (cpi->common).mi_params.mi_cols;
          uVar7 = (ulong)(uint)(iVar1 - mi_col);
          if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [bsize] <= iVar1 - mi_col) {
            uVar7 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [bsize];
          }
          iVar5 = mi_row * iVar1 + mi_col;
          bVar8 = 8;
          bVar9 = 0;
          do {
            uVar11 = uVar7;
            iVar10 = iVar5;
            if (0 < (int)uVar7) {
              do {
                bVar9 = pEVar4->map[iVar10];
                if (bVar8 < bVar9) {
                  bVar9 = bVar8;
                }
                iVar10 = iVar10 + 1;
                uVar11 = uVar11 - 1;
                bVar8 = bVar9;
              } while (uVar11 != 0);
            }
            segment_id = segment_id + 1;
            iVar5 = iVar5 + iVar1;
          } while (segment_id != uVar6);
          segment_id = (uint)(bVar9 & 7);
        }
      }
      *(ushort *)&pMVar2->field_0xa7 = uVar3 | (ushort)segment_id;
    }
    av1_init_plane_quantizers(cpi,x,segment_id,0);
    return;
  }
  return;
}

Assistant:

void av1_set_offsets(const AV1_COMP *const cpi, const TileInfo *const tile,
                     MACROBLOCK *const x, int mi_row, int mi_col,
                     BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const struct segmentation *const seg = &cm->seg;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);

  // Setup segment ID.
  mbmi = xd->mi[0];
  mbmi->segment_id = 0;
  if (seg->enabled) {
    if (seg->enabled && !cpi->vaq_refresh) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mbmi->segment_id =
          map ? get_segment_id(&cm->mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    av1_init_plane_quantizers(cpi, x, mbmi->segment_id, 0);
  }
#ifndef NDEBUG
  x->last_set_offsets_loc.mi_row = mi_row;
  x->last_set_offsets_loc.mi_col = mi_col;
  x->last_set_offsets_loc.bsize = bsize;
#endif  // NDEBUG
}